

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O0

void coords_desc(char *buf,wchar_t size,wchar_t y,wchar_t x)

{
  wchar_t wVar1;
  wchar_t wVar2;
  uint local_60;
  uint local_4c;
  wchar_t px;
  wchar_t py;
  char *north_or_south;
  char *east_or_west;
  wchar_t x_local;
  wchar_t y_local;
  wchar_t size_local;
  char *buf_local;
  
  wVar1 = (player->grid).y;
  wVar2 = (player->grid).x;
  if (wVar1 < y) {
    _px = "S";
  }
  else {
    _px = "N";
  }
  if (x < wVar2) {
    north_or_south = "W";
  }
  else {
    north_or_south = "E";
  }
  if (y - wVar1 < 0) {
    local_4c = -(y - wVar1);
  }
  else {
    local_4c = y - wVar1;
  }
  if (x - wVar2 < 0) {
    local_60 = -(x - wVar2);
  }
  else {
    local_60 = x - wVar2;
  }
  strnfmt(buf,(long)size,"%d %s, %d %s",(ulong)local_4c,_px,(ulong)local_60,north_or_south);
  return;
}

Assistant:

void coords_desc(char *buf, int size, int y, int x)
{
	const char *east_or_west;
	const char *north_or_south;

	int py = player->grid.y;
	int px = player->grid.x;

	if (y > py)
		north_or_south = "S";
	else
		north_or_south = "N";

	if (x < px)
		east_or_west = "W";
	else
		east_or_west = "E";

	strnfmt(buf, size, "%d %s, %d %s",
		ABS(y - py), north_or_south, ABS(x-px), east_or_west);
}